

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BitVector::vectorAnd
          (BitVector *this,BitVector *other,size_t offset,size_t count)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  unsigned_long uVar4;
  const_reference pvVar5;
  reference pvVar6;
  bool local_65;
  bool local_4a;
  unsigned_long local_40;
  unsigned_long local_38;
  ulong local_30;
  size_t ndx;
  size_t count_local;
  size_t offset_local;
  BitVector *other_local;
  BitVector *this_local;
  
  ndx = count;
  count_local = offset;
  offset_local = (size_t)other;
  other_local = this;
  for (local_30 = offset; uVar2 = local_30, local_30 < count_local + ndx && (local_30 & 0x1f) != 0;
      local_30 = local_30 + 1) {
    bVar3 = get((BitVector *)offset_local,local_30);
    local_4a = false;
    if (bVar3) {
      local_4a = get(this,local_30);
    }
    set(this,uVar2,local_4a);
  }
  while( true ) {
    uVar2 = local_30;
    local_38 = count_local + ndx;
    local_40 = 0x20;
    uVar4 = roundDownToMultiple<unsigned_long>(&local_38,&local_40);
    if (uVar4 <= uVar2) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)offset_local,
                        local_30 >> 5);
    uVar1 = *pvVar5;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_data,local_30 >> 5);
    *pvVar6 = uVar1 & *pvVar6;
    local_30 = local_30 + 0x20;
  }
  for (; uVar2 = local_30, local_30 < count_local + ndx; local_30 = local_30 + 1) {
    bVar3 = get((BitVector *)offset_local,local_30);
    local_65 = false;
    if (bVar3) {
      local_65 = get(this,local_30);
    }
    set(this,uVar2,local_65);
  }
  return;
}

Assistant:

void vectorAnd (const BitVector& other, size_t offset, size_t count)
	{
		size_t ndx = offset;

		for (; ndx < offset + count && (ndx % BLOCK_BIT_SIZE) != 0; ndx++)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			set(ndx, other.get(ndx) && get(ndx));
		}

		for (; ndx < roundDownToMultiple<size_t>(offset + count, BLOCK_BIT_SIZE); ndx += BLOCK_BIT_SIZE)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			DE_ASSERT(ndx % BLOCK_BIT_SIZE == 0);
			DE_ASSERT(ndx + BLOCK_BIT_SIZE <= offset + count);
			m_data[ndx / BLOCK_BIT_SIZE] &= other.m_data[ndx / BLOCK_BIT_SIZE];
		}

		for (; ndx < offset + count; ndx++)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			set(ndx, other.get(ndx) && get(ndx));
		}
	}